

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void CMinitialize(CManager_conflict cm)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  bool bVar3;
  char *def;
  char **transport_names;
  int in_stack_0000005c;
  char *in_stack_00000060;
  CManager in_stack_00000068;
  char **local_10;
  
  local_10 = CMglobal_alternate_transports;
  pcVar2 = getenv("CMDefaultTransport");
  if (pcVar2 != (char *)0x0) {
    CMglobal_default_transport = pcVar2;
  }
  if ((CMglobal_default_transport != (char *)0x0) &&
     (iVar1 = load_transport(in_stack_00000068,in_stack_00000060,in_stack_0000005c), iVar1 == 0)) {
    fprintf(_stderr,"Failed to initialize default transport.  Exiting.\n");
    exit(1);
  }
  while( true ) {
    bVar3 = false;
    if (local_10 != (char **)0x0) {
      bVar3 = *local_10 != (char *)0x0;
    }
    if (!bVar3) break;
    load_transport(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
    local_10 = local_10 + 1;
  }
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  return;
}

Assistant:

static void 
CMinitialize(CManager cm)
{
    char **transport_names = CMglobal_alternate_transports;
    char *def = getenv("CMDefaultTransport");
    if (def != NULL) CMglobal_default_transport = def;
    if (CMglobal_default_transport) {
	if (load_transport(cm, CMglobal_default_transport, 0) == 0) {
	    fprintf(stderr, "Failed to initialize default transport.  Exiting.\n");
	    exit(1);
	}
    }
    while ((transport_names != NULL) && (transport_names[0] != NULL)) {
	load_transport(cm, transport_names[0], 1);
	transport_names++;
    }
    cm->initialized++;
}